

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_shared_expressions.cpp
# Opt level: O0

vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> *
duckdb::WindowSharedExpressions::GetSortedExpressions(Shared *shared)

{
  bool bVar1;
  reference puVar2;
  long in_RSI;
  vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> *in_RDI;
  unsigned_long col_idx;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_true> *__range2;
  Expression *expr;
  pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>_> *col;
  iterator __end1;
  iterator __begin1;
  expression_map_t<vector<column_t>_> *__range1;
  vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> *sorted;
  unordered_map<std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>_>_>_>
  *in_stack_ffffffffffffff58;
  vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> *in_stack_ffffffffffffff60;
  optional_ptr<const_duckdb::Expression,_true> local_78;
  unsigned_long local_70;
  unsigned_long *local_68;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  vector<unsigned_long,_true> *local_58;
  Expression *local_50;
  reference local_48;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>_>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>_>,_true>
  local_38;
  long local_30;
  undefined1 local_11;
  long local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  ::std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>::allocator
            ((allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_> *)0x1a4587e);
  vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true>::vector
            (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58,
             (allocator_type *)0x1a45892);
  ::std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>::~allocator
            ((allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_> *)0x1a458a1);
  local_30 = local_10 + 8;
  local_38._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>_>_>_>
       ::begin(in_stack_ffffffffffffff58);
  local_40._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>_>_>_>
       ::end(in_stack_ffffffffffffff58);
  while (bVar1 = ::std::__detail::operator!=(&local_38,&local_40), bVar1) {
    local_48 = ::std::__detail::
               _Node_iterator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>_>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>_>,_false,_true>
                            *)0x1a458f2);
    local_50 = ::std::reference_wrapper<duckdb::Expression>::get(&local_48->first);
    local_58 = &local_48->second;
    local_60._M_current =
         (unsigned_long *)
         ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffff58);
    local_68 = (unsigned_long *)
               ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_ffffffffffffff60,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_60);
      local_70 = *puVar2;
      optional_ptr<const_duckdb::Expression,_true>::optional_ptr(&local_78,local_50);
      in_stack_ffffffffffffff60 =
           (vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> *)
           vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true>::operator[]
                     (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
      (in_stack_ffffffffffffff60->
      super_vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
      ).
      super__Vector_base<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78.ptr;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_60);
    }
    ::std::__detail::
    _Node_iterator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::vector<unsigned_long,_true>_>,_false,_true>
                  *)in_stack_ffffffffffffff60);
  }
  return in_RDI;
}

Assistant:

vector<optional_ptr<const Expression>> WindowSharedExpressions::GetSortedExpressions(Shared &shared) {
	vector<optional_ptr<const Expression>> sorted(shared.size);
	for (auto &col : shared.columns) {
		auto &expr = col.first.get();
		for (auto col_idx : col.second) {
			sorted[col_idx] = &expr;
		}
	}

	return sorted;
}